

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  bool bVar8;
  size_t sVar9;
  undefined8 uVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  Reduction *pRVar16;
  Reduction *pRVar17;
  uint uVar18;
  uint uVar19;
  size_t sVar20;
  uint uVar21;
  long lVar22;
  void *pvVar23;
  int i;
  uint uVar24;
  void *unaff_RBP;
  float *pfVar25;
  long lVar26;
  Reduction *pRVar27;
  ulong uVar28;
  Reduction *pRVar29;
  undefined4 uVar30;
  size_t sVar31;
  Reduction *pRVar32;
  Reduction *pRVar33;
  float *pfVar34;
  Reduction *pRVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  void *pvVar39;
  void *pvVar40;
  ulong uVar41;
  float *pfVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  float fVar48;
  int iVar55;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float local_17c;
  int local_16c;
  void *local_150;
  byte local_130;
  byte local_c4;
  byte local_c0;
  float local_b4;
  undefined1 local_98 [80];
  int axes_flag [4];
  
  uVar14 = bottom_blob->dims;
  axes_flag[0] = 0;
  axes_flag[1] = 0;
  axes_flag[2] = 0;
  axes_flag[3] = 0;
  pRVar32 = (Reduction *)bottom_blob;
  if (this->reduce_all != 0) {
    bVar45 = true;
    bVar44 = true;
    auVar56 = _DAT_0053cca0;
    goto LAB_002f9b60;
  }
  pvVar23 = (this->axes).data;
  uVar21 = (this->axes).w;
  uVar41 = 0;
  uVar37 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    uVar37 = uVar41;
  }
  for (; uVar37 != uVar41; uVar41 = uVar41 + 1) {
    iVar55 = *(int *)((long)pvVar23 + uVar41 * 4);
    pRVar32 = (Reduction *)(long)(int)((iVar55 >> 0x1f & uVar14) + iVar55);
    axes_flag[(long)pRVar32] = 1;
  }
  iVar55 = axes_flag[2];
  switch(uVar14) {
  case 1:
    auVar56 = _DAT_0053ccb0;
    break;
  case 2:
    auVar56._0_4_ = -(uint)(axes_flag[0] == 1);
    auVar56._4_4_ = -(uint)(axes_flag[1] == 1);
    auVar56._8_4_ = -(uint)(axes_flag[1] == 1);
    auVar56._12_4_ = 0xffffffff;
    break;
  case 3:
    bVar44 = axes_flag[0] == 1;
    auVar56._0_4_ = -(uint)(axes_flag[1] == 1);
    auVar56._4_4_ = -(uint)(iVar55 == 1);
    auVar56._8_4_ = -(uint)(iVar55 == 1);
    auVar56._12_4_ = 0xffffffff;
    bVar45 = false;
    goto LAB_002f9b60;
  case 4:
    bVar44 = axes_flag[0] == 1;
    bVar45 = axes_flag[1] == 1;
    auVar56._0_4_ = -(uint)(iVar55 == 1);
    auVar56._4_4_ = -(uint)(axes_flag[3] == 1);
    auVar56._8_4_ = -(uint)(axes_flag[3] == 1);
    auVar56._12_4_ = 0xffffffff;
    goto LAB_002f9b60;
  default:
    auVar56 = (undefined1  [16])0x0;
  }
  bVar45 = false;
  bVar44 = false;
LAB_002f9b60:
  iVar55 = this->operation;
  if (iVar55 - 1U < 10) {
    uVar37 = (ulong)(iVar55 - 1U);
    local_17c = *(float *)(&DAT_0053cda4 + uVar37 * 4);
    iVar1 = *(int *)(&DAT_0053cdcc + uVar37 * 4);
    local_16c = *(int *)(&DAT_0053cdf4 + uVar37 * 4);
  }
  else {
    iVar1 = 0;
    local_17c = 0.0;
    local_16c = 0;
  }
  local_b4 = this->coeff;
  sVar5 = bottom_blob->elemsize;
  if (uVar14 == 1) {
    uVar21 = bottom_blob->w;
    Mat::create(top_blob,1,sVar5,opt->blob_allocator);
    this = (Reduction *)bottom_blob->data;
    pRVar32 = (Reduction *)(ulong)uVar21;
    fVar48 = reduction(local_17c,(float *)this,uVar21,local_16c);
    *(float *)top_blob->data = fVar48;
    bVar8 = false;
    bVar46 = false;
    bVar47 = false;
  }
  else {
    iVar2 = this->keepdims;
    bVar46 = uVar14 == 2;
    local_c4 = auVar56[8];
    local_c0 = auVar56[0];
    if (bVar46) {
      uVar21 = bottom_blob->w;
      uVar19 = bottom_blob->h;
      unaff_RBP = (void *)(ulong)uVar19;
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar50._0_8_ = SUB168(auVar49 ^ auVar56,0) << 0x3f;
      auVar50._8_8_ = SUB168(auVar49 ^ auVar56,8) << 0x3f;
      uVar36 = movmskpd((int)bottom_blob,auVar50);
      if (uVar36 == 0) {
        if (iVar2 == 0) {
          Mat::create(top_blob,1,sVar5,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,sVar5,opt->blob_allocator);
        }
        local_98._64_8_ = 0;
        local_98._0_8_ = (Reduction *)0x0;
        local_98[8] = false;
        local_98[9] = false;
        local_98[10] = false;
        local_98[0xb] = false;
        local_98[0xc] = false;
        local_98[0xd] = false;
        local_98[0xe] = false;
        local_98[0xf] = false;
        local_98[0x10] = false;
        local_98[0x11] = false;
        local_98[0x12] = false;
        local_98[0x13] = false;
        local_98[0x14] = false;
        local_98[0x15] = false;
        local_98[0x16] = false;
        local_98[0x17] = false;
        local_98._24_4_ = 0;
        local_98._32_8_ = (Reduction *)0x0;
        local_98._40_4_ = 0;
        local_98._44_4_ = 0;
        local_98._48_4_ = 0;
        local_98._52_8_ = 0;
        Mat::create((Mat *)local_98,uVar19,sVar5,opt->workspace_allocator);
        this = (Reduction *)local_98._0_8_;
        if (((Reduction *)local_98._0_8_ == (Reduction *)0x0) ||
           ((long)(int)local_98._56_4_ * local_98._64_8_ == 0)) {
          piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
          if (piVar7 == (int *)0x0) {
            return -100;
          }
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 != 0) {
            return -100;
          }
          if ((Reduction *)local_98._32_8_ != (Reduction *)0x0) {
            (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
            return -100;
          }
          goto LAB_002fb411;
        }
        pfVar34 = (float *)bottom_blob->data;
        unaff_RBP = (void *)((long)bottom_blob->w * bottom_blob->elemsize);
        uVar37 = 0;
        uVar41 = 0;
        if (0 < (int)uVar19) {
          uVar41 = (ulong)uVar19;
        }
        for (; uVar41 != uVar37; uVar37 = uVar37 + 1) {
          fVar48 = reduction(local_17c,pfVar34,uVar21,local_16c);
          *(float *)((long)&(this->super_Layer)._vptr_Layer + uVar37 * 4) = fVar48;
          pfVar34 = (float *)((long)pfVar34 + (long)unaff_RBP);
        }
        pRVar32 = (Reduction *)(ulong)uVar19;
        fVar48 = reduction(local_17c,(float *)this,uVar19,iVar1);
        *(float *)top_blob->data = fVar48;
        piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pRVar32 = (Reduction *)local_98._0_8_;
            if ((Reduction *)local_98._32_8_ == (Reduction *)0x0) {
              this = (Reduction *)local_98._0_8_;
              free((void *)local_98._0_8_);
            }
            else {
              this = (Reduction *)local_98._32_8_;
              (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
            }
          }
        }
      }
      if ((((byte)(uVar36 >> 1) & 0x7f | local_c0) & 1) == 0) {
        if (iVar2 == 0) {
          pRVar32 = (Reduction *)(ulong)uVar19;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar19,sVar5,opt->blob_allocator);
        }
        else {
          pRVar32 = (Reduction *)0x1;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar19,sVar5,opt->blob_allocator);
        }
        pRVar29 = (Reduction *)bottom_blob->data;
        iVar13 = bottom_blob->w;
        sVar20 = bottom_blob->elemsize;
        unaff_RBP = top_blob->data;
        uVar37 = 0;
        uVar41 = 0;
        if (0 < (int)uVar19) {
          uVar41 = (ulong)uVar19;
        }
        for (; uVar41 != uVar37; uVar37 = uVar37 + 1) {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = pRVar29;
          fVar48 = reduction(local_17c,(float *)pRVar29,uVar21,local_16c);
          *(float *)((long)unaff_RBP + uVar37 * 4) = fVar48;
          pRVar29 = (Reduction *)((long)&(pRVar29->super_Layer)._vptr_Layer + (long)iVar13 * sVar20)
          ;
        }
      }
      if ((((byte)uVar36 | local_c4) & 1) == 0) {
        if (iVar2 == 0) {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar21,sVar5,opt->blob_allocator);
        }
        else {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar21,1,sVar5,opt->blob_allocator);
        }
        pvVar23 = bottom_blob->data;
        iVar13 = bottom_blob->w;
        pvVar40 = top_blob->data;
        unaff_RBP = (void *)0x0;
        pvVar39 = (void *)(ulong)uVar21;
        if ((int)uVar21 < 1) {
          pvVar39 = unaff_RBP;
        }
        for (; (void *)((long)pvVar39 * 4) != unaff_RBP; unaff_RBP = (void *)((long)unaff_RBP + 4))
        {
          this = (Reduction *)((long)pvVar23 + (long)unaff_RBP);
          pRVar32 = (Reduction *)(ulong)uVar19;
          fVar48 = reduction(local_17c,(float *)this,uVar19,iVar13,local_16c);
          *(float *)((long)pvVar40 + (long)unaff_RBP) = fVar48;
        }
      }
    }
    bVar47 = uVar14 == 3;
    if (bVar47) {
      uVar21 = bottom_blob->w;
      uVar19 = bottom_blob->h;
      uVar36 = bottom_blob->c;
      pRVar29 = (Reduction *)(ulong)uVar36;
      uVar15 = uVar19 * uVar21;
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      auVar52._0_8_ = SUB168(auVar51 ^ auVar56,0) << 0x3f;
      auVar52._8_8_ = SUB168(auVar51 ^ auVar56,8) << 0x3f;
      uVar24 = movmskpd((int)unaff_RBP,auVar52);
      uVar37 = (ulong)uVar24;
      bVar8 = (bool)(bVar44 ^ 1);
      if ((uVar24 == 0) && (!bVar8)) {
        if (iVar2 == 0) {
          Mat::create(top_blob,1,sVar5,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,sVar5,opt->blob_allocator);
        }
        local_98._64_8_ = 0;
        local_98._0_8_ = (Reduction *)0x0;
        local_98[8] = false;
        local_98[9] = false;
        local_98[10] = false;
        local_98[0xb] = false;
        local_98[0xc] = false;
        local_98[0xd] = false;
        local_98[0xe] = false;
        local_98[0xf] = false;
        local_98[0x10] = false;
        local_98[0x11] = false;
        local_98[0x12] = false;
        local_98[0x13] = false;
        local_98[0x14] = false;
        local_98[0x15] = false;
        local_98[0x16] = false;
        local_98[0x17] = false;
        local_98._24_4_ = 0;
        local_98._32_8_ = (Reduction *)0x0;
        local_98._40_4_ = 0;
        local_98._44_4_ = 0;
        local_98._48_4_ = 0;
        local_98._52_8_ = 0;
        Mat::create((Mat *)local_98,uVar36,sVar5,opt->workspace_allocator);
        this = (Reduction *)local_98._0_8_;
        if (((Reduction *)local_98._0_8_ == (Reduction *)0x0) ||
           ((long)(int)local_98._56_4_ * local_98._64_8_ == 0)) {
          piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
          if (piVar7 == (int *)0x0) {
            return -100;
          }
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 != 0) {
            return -100;
          }
          if ((Reduction *)local_98._32_8_ != (Reduction *)0x0) {
            (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
            return -100;
          }
          goto LAB_002fb411;
        }
        pfVar34 = (float *)bottom_blob->data;
        sVar20 = bottom_blob->elemsize;
        sVar31 = bottom_blob->cstep;
        uVar41 = 0;
        uVar37 = 0;
        if (0 < (int)uVar36) {
          uVar37 = (ulong)uVar36;
        }
        for (; uVar37 != uVar41; uVar41 = uVar41 + 1) {
          fVar48 = reduction(local_17c,pfVar34,uVar15,local_16c);
          *(float *)((long)&(this->super_Layer)._vptr_Layer + uVar41 * 4) = fVar48;
          pfVar34 = (float *)((long)pfVar34 + sVar20 * sVar31);
        }
        pRVar32 = pRVar29;
        fVar48 = reduction(local_17c,(float *)this,uVar36,iVar1);
        *(float *)top_blob->data = fVar48;
        piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
        uVar37 = 0;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pRVar32 = (Reduction *)local_98._0_8_;
            if ((Reduction *)local_98._32_8_ == (Reduction *)0x0) {
              this = (Reduction *)local_98._0_8_;
              free((void *)local_98._0_8_);
            }
            else {
              this = (Reduction *)local_98._32_8_;
              (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
            }
          }
        }
      }
      local_130 = (byte)(uVar37 >> 1) & 0x7f;
      if (uVar24 == 0 && !bVar44) {
        if (iVar2 == 0) {
          pRVar32 = pRVar29;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar36,sVar5,opt->blob_allocator);
        }
        else {
          pRVar32 = (Reduction *)0x1;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,1,uVar36,sVar5,opt->blob_allocator);
        }
        pRVar17 = (Reduction *)bottom_blob->data;
        sVar20 = bottom_blob->elemsize;
        sVar31 = top_blob->elemsize;
        sVar6 = top_blob->cstep;
        pRVar33 = (Reduction *)0x0;
        if (0 < (int)uVar36) {
          pRVar33 = pRVar29;
        }
        pfVar34 = (float *)top_blob->data;
        sVar9 = bottom_blob->cstep;
        pfVar42 = pfVar34;
        while (bVar43 = pRVar33 != (Reduction *)0x0, pRVar33 = (Reduction *)&pRVar33[-1].field_0x12f
              , bVar43) {
          pfVar25 = pfVar34;
          if (iVar2 == 0) {
            pfVar25 = pfVar42;
          }
          pRVar32 = (Reduction *)(ulong)uVar15;
          this = pRVar17;
          fVar48 = reduction(local_17c,(float *)pRVar17,uVar15,local_16c);
          *pfVar25 = fVar48;
          pfVar34 = (float *)((long)pfVar34 + sVar31 * sVar6);
          pfVar42 = pfVar42 + 1;
          pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + sVar20 * sVar9);
        }
      }
      if (((local_130 | local_c0) & 1) == 0 && !bVar8) {
        if (iVar2 == 0) {
          pRVar32 = (Reduction *)(ulong)uVar19;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar19,sVar5,opt->blob_allocator);
        }
        else {
          pRVar32 = (Reduction *)0x1;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar19,1,sVar5,opt->blob_allocator);
        }
        pRVar17 = (Reduction *)bottom_blob->data;
        iVar13 = bottom_blob->w;
        sVar20 = bottom_blob->cstep;
        pvVar23 = top_blob->data;
        uVar37 = 0;
        uVar41 = 0;
        if (0 < (int)uVar19) {
          uVar41 = (ulong)uVar19;
        }
        sVar31 = bottom_blob->elemsize;
        for (; uVar41 != uVar37; uVar37 = uVar37 + 1) {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = pRVar17;
          fVar48 = reduction(local_17c,(float *)pRVar17,uVar21,uVar36,(int)sVar20,local_16c);
          *(float *)((long)pvVar23 + uVar37 * 4) = fVar48;
          pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + (long)iVar13 * sVar31)
          ;
        }
      }
      bVar11 = (byte)uVar24 | local_c4;
      if ((bVar11 & 1) == 0 && !bVar8) {
        if (iVar2 == 0) {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar21,sVar5,opt->blob_allocator);
        }
        else {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar21,1,1,sVar5,opt->blob_allocator);
        }
        pvVar23 = bottom_blob->data;
        sVar20 = bottom_blob->cstep;
        pvVar40 = top_blob->data;
        lVar22 = 0;
        uVar37 = 0;
        if (0 < (int)uVar21) {
          uVar37 = (ulong)uVar21;
        }
        for (; uVar37 * 4 != lVar22; lVar22 = lVar22 + 4) {
          this = (Reduction *)((long)pvVar23 + lVar22);
          pRVar32 = (Reduction *)(ulong)uVar19;
          fVar48 = reduction(local_17c,(float *)this,uVar19,uVar21,uVar36,(int)sVar20,local_16c);
          *(float *)((long)pvVar40 + lVar22) = fVar48;
        }
      }
      if (((local_130 | local_c0) & 1) == 0 && !bVar44) {
        if (iVar2 == 0) {
          pRVar32 = (Reduction *)(ulong)uVar19;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar19,uVar36,sVar5,opt->blob_allocator);
        }
        else {
          pRVar32 = (Reduction *)0x1;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,1,uVar19,uVar36,sVar5,opt->blob_allocator);
        }
        uVar37 = 0;
        if (0 < (int)uVar19) {
          uVar37 = (ulong)uVar19;
        }
        pRVar17 = (Reduction *)0x0;
        if (0 < (int)uVar36) {
          pRVar17 = pRVar29;
        }
        sVar20 = bottom_blob->elemsize;
        if (iVar2 == 0) {
          sVar31 = (size_t)top_blob->w;
        }
        else {
          sVar31 = top_blob->cstep;
        }
        pRVar33 = (Reduction *)bottom_blob->data;
        sVar6 = top_blob->elemsize;
        pvVar23 = top_blob->data;
        sVar9 = bottom_blob->cstep;
        for (pRVar16 = (Reduction *)0x0; pRVar16 != pRVar17;
            pRVar16 = (Reduction *)((long)&(pRVar16->super_Layer)._vptr_Layer + 1)) {
          pRVar35 = pRVar33;
          for (uVar41 = 0; uVar37 != uVar41; uVar41 = uVar41 + 1) {
            pRVar32 = (Reduction *)(ulong)uVar21;
            this = pRVar35;
            fVar48 = reduction(local_17c,(float *)pRVar35,uVar21,local_16c);
            *(float *)((long)pvVar23 + uVar41 * 4) = fVar48;
            pRVar35 = (Reduction *)
                      ((long)&(pRVar35->super_Layer)._vptr_Layer + (long)(int)uVar21 * 4);
          }
          pvVar23 = (void *)((long)pvVar23 + sVar31 * sVar6);
          pRVar33 = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + sVar20 * sVar9);
        }
      }
      if (((local_c0 | local_c4) & 1) == 0 && !bVar8) {
        if (iVar2 == 0) {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar21,uVar19,sVar5,opt->blob_allocator);
        }
        else {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar21,uVar19,1,sVar5,opt->blob_allocator);
        }
        pvVar23 = bottom_blob->data;
        sVar20 = bottom_blob->cstep;
        pvVar40 = top_blob->data;
        pRVar33 = (Reduction *)0x0;
        pRVar17 = (Reduction *)(ulong)uVar15;
        if ((int)uVar15 < 1) {
          pRVar17 = pRVar33;
        }
        for (; (Reduction *)((long)pRVar17 * 4) != pRVar33;
            pRVar33 = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + 4)) {
          this = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + (long)pvVar23);
          pRVar32 = pRVar29;
          fVar48 = reduction(local_17c,(float *)this,uVar36,(int)sVar20,local_16c);
          *(float *)((long)&(pRVar33->super_Layer)._vptr_Layer + (long)pvVar40) = fVar48;
        }
      }
      if ((bVar11 & 1) == 0 && !bVar44) {
        if (iVar2 == 0) {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar21,uVar36,sVar5,opt->blob_allocator);
        }
        else {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = (Reduction *)top_blob;
          Mat::create(top_blob,uVar21,1,uVar36,sVar5,opt->blob_allocator);
        }
        uVar37 = 0;
        if (0 < (int)uVar21) {
          uVar37 = (ulong)uVar21;
        }
        if ((int)uVar36 < 1) {
          uVar36 = 0;
        }
        sVar20 = bottom_blob->elemsize;
        if (iVar2 == 0) {
          sVar31 = (size_t)top_blob->w;
        }
        else {
          sVar31 = top_blob->cstep;
        }
        pvVar23 = bottom_blob->data;
        sVar6 = top_blob->elemsize;
        pvVar40 = top_blob->data;
        sVar9 = bottom_blob->cstep;
        for (uVar41 = 0; uVar41 != uVar36; uVar41 = uVar41 + 1) {
          for (lVar22 = 0; uVar37 * 4 != lVar22; lVar22 = lVar22 + 4) {
            this = (Reduction *)(lVar22 + (long)pvVar23);
            pRVar32 = (Reduction *)(ulong)uVar19;
            fVar48 = reduction(local_17c,(float *)this,uVar19,uVar21,local_16c);
            *(float *)((long)pvVar40 + lVar22) = fVar48;
          }
          pvVar40 = (void *)((long)pvVar40 + sVar31 * sVar6);
          pvVar23 = (void *)((long)pvVar23 + sVar20 * sVar9);
        }
      }
    }
    if (uVar14 != 4) {
      bVar8 = false;
      goto LAB_002fabf4;
    }
    uVar21 = bottom_blob->w;
    lVar22 = (long)(int)uVar21;
    uVar19 = bottom_blob->h;
    uVar36 = bottom_blob->d;
    uVar15 = bottom_blob->c;
    pRVar29 = (Reduction *)(ulong)uVar15;
    uVar24 = uVar19 * uVar21;
    uVar18 = uVar24 * uVar36;
    auVar53._8_4_ = 0xffffffff;
    auVar53._0_8_ = 0xffffffffffffffff;
    auVar53._12_4_ = 0xffffffff;
    auVar54._0_8_ = SUB168(auVar53 ^ auVar56,0) << 0x3f;
    auVar54._8_8_ = SUB168(auVar53 ^ auVar56,8) << 0x3f;
    iVar13 = movmskpd(uVar36,auVar54);
    bVar47 = iVar13 == 0;
    bVar46 = (bool)(bVar45 ^ 1);
    bVar8 = (bool)(bVar44 ^ 1);
    if ((bVar47 && !bVar46) && (bVar44)) {
      if (iVar2 == 0) {
        Mat::create(top_blob,1,sVar5,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,1,1,sVar5,opt->blob_allocator);
      }
      local_98._64_8_ = 0;
      local_98._0_8_ = (Reduction *)0x0;
      local_98[8] = false;
      local_98[9] = false;
      local_98[10] = false;
      local_98[0xb] = false;
      local_98[0xc] = false;
      local_98[0xd] = false;
      local_98[0xe] = false;
      local_98[0xf] = false;
      local_98[0x10] = false;
      local_98[0x11] = false;
      local_98[0x12] = false;
      local_98[0x13] = false;
      local_98[0x14] = false;
      local_98[0x15] = false;
      local_98[0x16] = false;
      local_98[0x17] = false;
      local_98._24_4_ = 0;
      local_98._32_8_ = (Reduction *)0x0;
      local_98._40_4_ = 0;
      local_98._44_4_ = 0;
      local_98._48_4_ = 0;
      local_98._52_8_ = 0;
      Mat::create((Mat *)local_98,uVar15,sVar5,opt->workspace_allocator);
      this = (Reduction *)local_98._0_8_;
      if (((Reduction *)local_98._0_8_ == (Reduction *)0x0) ||
         ((long)(int)local_98._56_4_ * local_98._64_8_ == 0)) {
        piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
        if (piVar7 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 != 0) {
          return -100;
        }
        if ((Reduction *)local_98._32_8_ != (Reduction *)0x0) {
          (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
          return -100;
        }
        goto LAB_002fb411;
      }
      pfVar34 = (float *)bottom_blob->data;
      sVar20 = bottom_blob->elemsize;
      sVar31 = bottom_blob->cstep;
      uVar37 = 0;
      uVar41 = 0;
      if (0 < (int)uVar15) {
        uVar41 = (ulong)uVar15;
      }
      for (; uVar41 != uVar37; uVar37 = uVar37 + 1) {
        fVar48 = reduction(local_17c,pfVar34,uVar18,local_16c);
        *(float *)((long)&(this->super_Layer)._vptr_Layer + uVar37 * 4) = fVar48;
        pfVar34 = (float *)((long)pfVar34 + sVar20 * sVar31);
      }
      pRVar32 = pRVar29;
      fVar48 = reduction(local_17c,(float *)this,uVar15,iVar1);
      *(float *)top_blob->data = fVar48;
      piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          pRVar32 = (Reduction *)local_98._0_8_;
          if ((Reduction *)local_98._32_8_ == (Reduction *)0x0) {
            this = (Reduction *)local_98._0_8_;
            free((void *)local_98._0_8_);
          }
          else {
            this = (Reduction *)local_98._32_8_;
            (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
          }
        }
      }
    }
    if ((bVar47 && !bVar46) && !bVar44) {
      if (iVar2 == 0) {
        pRVar32 = pRVar29;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar15,sVar5,opt->blob_allocator);
      }
      else {
        pRVar32 = (Reduction *)0x1;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,1,1,1,uVar15,sVar5,opt->blob_allocator);
      }
      pRVar17 = (Reduction *)bottom_blob->data;
      sVar20 = bottom_blob->elemsize;
      sVar31 = top_blob->elemsize;
      sVar6 = top_blob->cstep;
      pRVar33 = (Reduction *)0x0;
      if (0 < (int)uVar15) {
        pRVar33 = pRVar29;
      }
      pfVar34 = (float *)top_blob->data;
      sVar9 = bottom_blob->cstep;
      pfVar42 = pfVar34;
      while (bVar43 = pRVar33 != (Reduction *)0x0, pRVar33 = (Reduction *)&pRVar33[-1].field_0x12f,
            bVar43) {
        pfVar25 = pfVar34;
        if (iVar2 == 0) {
          pfVar25 = pfVar42;
        }
        pRVar32 = (Reduction *)(ulong)uVar18;
        this = pRVar17;
        fVar48 = reduction(local_17c,(float *)pRVar17,uVar18,local_16c);
        *pfVar25 = fVar48;
        pfVar34 = (float *)((long)pfVar34 + sVar31 * sVar6);
        pfVar42 = pfVar42 + 1;
        pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + sVar20 * sVar9);
      }
    }
    if ((bVar47 && !bVar45) && !bVar8) {
      if (iVar2 == 0) {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar36,sVar5,opt->blob_allocator);
      }
      else {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,1,1,uVar36,1,sVar5,opt->blob_allocator);
      }
      iVar4 = bottom_blob->w;
      iVar3 = bottom_blob->h;
      pRVar17 = (Reduction *)bottom_blob->data;
      uVar18 = (uint)bottom_blob->cstep;
      pRVar32 = (Reduction *)(ulong)uVar18;
      uVar41 = 0;
      uVar37 = 0;
      if (0 < (int)uVar36) {
        uVar37 = (ulong)uVar36;
      }
      pvVar23 = top_blob->data;
      sVar20 = bottom_blob->elemsize;
      for (; uVar37 != uVar41; uVar41 = uVar41 + 1) {
        pRVar32 = (Reduction *)(ulong)uVar24;
        this = pRVar17;
        fVar48 = reduction(local_17c,(float *)pRVar17,uVar24,uVar15,uVar18,local_16c);
        *(float *)((long)pvVar23 + uVar41 * 4) = fVar48;
        pRVar17 = (Reduction *)
                  ((long)&(pRVar17->super_Layer)._vptr_Layer + (long)iVar3 * sVar20 * (long)iVar4);
      }
    }
    bVar11 = (byte)iVar13 >> 1 | local_c0;
    if (((bVar11 & 1) == 0 && !bVar46) && !bVar8) {
      if (iVar2 == 0) {
        Mat::create(top_blob,uVar19,sVar5,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,uVar19,1,1,sVar5,opt->blob_allocator);
      }
      this = (Reduction *)local_98;
      local_98._64_8_ = 0;
      local_98._0_8_ = (Reduction *)0x0;
      local_98[8] = false;
      local_98[9] = false;
      local_98[10] = false;
      local_98[0xb] = false;
      local_98[0xc] = false;
      local_98[0xd] = false;
      local_98[0xe] = false;
      local_98[0xf] = false;
      local_98[0x10] = false;
      local_98[0x11] = false;
      local_98[0x12] = false;
      local_98[0x13] = false;
      local_98[0x14] = false;
      local_98[0x15] = false;
      local_98[0x16] = false;
      local_98[0x17] = false;
      local_98._24_4_ = 0;
      local_98._32_8_ = (Reduction *)0x0;
      local_98._40_4_ = 0;
      local_98._44_4_ = 0;
      local_98._48_4_ = 0;
      local_98._52_8_ = 0;
      Mat::create((Mat *)this,uVar19,1,uVar15,sVar5,opt->workspace_allocator);
      if (((Reduction *)local_98._0_8_ == (Reduction *)0x0) ||
         ((long)(int)local_98._56_4_ * local_98._64_8_ == 0)) {
        piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
        if (piVar7 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 != 0) {
          return -100;
        }
        if ((Reduction *)local_98._32_8_ != (Reduction *)0x0) {
          (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
          return -100;
        }
LAB_002fb411:
        free((void *)local_98._0_8_);
        return -100;
      }
      pRVar17 = (Reduction *)bottom_blob->data;
      lVar26 = local_98._64_8_ * CONCAT44(local_98._20_4_,local_98._16_4_);
      pRVar32 = (Reduction *)0x0;
      uVar37 = 0;
      if (0 < (int)uVar19) {
        uVar37 = (ulong)uVar19;
      }
      pRVar33 = (Reduction *)0x0;
      if (0 < (int)uVar15) {
        pRVar33 = pRVar29;
      }
      sVar20 = bottom_blob->elemsize;
      sVar31 = bottom_blob->cstep;
      pRVar16 = (Reduction *)local_98._0_8_;
      for (; uVar10 = local_98._0_8_, pRVar32 != pRVar33;
          pRVar32 = (Reduction *)((long)&(pRVar32->super_Layer)._vptr_Layer + 1)) {
        pRVar35 = pRVar17;
        for (uVar41 = 0; uVar37 != uVar41; uVar41 = uVar41 + 1) {
          this = pRVar35;
          fVar48 = reduction(local_17c,(float *)pRVar35,uVar21,uVar36,uVar24,local_16c);
          *(float *)((long)&(pRVar16->super_Layer)._vptr_Layer + uVar41 * 4) = fVar48;
          pRVar35 = (Reduction *)((long)&(pRVar35->super_Layer)._vptr_Layer + lVar22 * 4);
        }
        pRVar16 = (Reduction *)((long)&(pRVar16->super_Layer)._vptr_Layer + lVar26);
        pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + sVar20 * sVar31);
      }
      uVar30 = local_98._64_4_;
      pvVar23 = top_blob->data;
      for (lVar26 = 0; uVar37 << 2 != lVar26; lVar26 = lVar26 + 4) {
        this = (Reduction *)((long)&((Layer *)uVar10)->_vptr_Layer + lVar26);
        pRVar32 = pRVar29;
        fVar48 = reduction(local_17c,(float *)this,uVar15,uVar30,iVar1);
        *(float *)((long)pvVar23 + lVar26) = fVar48;
      }
      piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          pRVar32 = (Reduction *)local_98._0_8_;
          if ((Reduction *)local_98._32_8_ == (Reduction *)0x0) {
            this = (Reduction *)local_98._0_8_;
            free((void *)local_98._0_8_);
          }
          else {
            this = (Reduction *)local_98._32_8_;
            (*((Layer *)local_98._32_8_)->_vptr_Layer[3])();
          }
        }
      }
    }
    bVar12 = (byte)iVar13 | local_c4;
    if (((bVar12 & 1) == 0 && !bVar46) && !bVar8) {
      if (iVar2 == 0) {
        pRVar32 = (Reduction *)(ulong)uVar21;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,sVar5,opt->blob_allocator);
      }
      else {
        pRVar32 = (Reduction *)(ulong)uVar21;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,1,1,1,sVar5,opt->blob_allocator);
      }
      pvVar23 = bottom_blob->data;
      sVar20 = bottom_blob->cstep;
      pvVar40 = top_blob->data;
      lVar26 = 0;
      uVar37 = 0;
      if (0 < (int)uVar21) {
        uVar37 = (ulong)uVar21;
      }
      for (; uVar37 * 4 != lVar26; lVar26 = lVar26 + 4) {
        this = (Reduction *)((long)pvVar23 + lVar26);
        pRVar32 = (Reduction *)(ulong)(uVar36 * uVar19);
        fVar48 = reduction(local_17c,(float *)this,uVar36 * uVar19,uVar21,uVar15,(int)sVar20,
                           local_16c);
        *(float *)((long)pvVar40 + lVar26) = fVar48;
      }
    }
    if ((bVar47 && !bVar45) && !bVar44) {
      if (iVar2 == 0) {
        Mat::create(top_blob,uVar36,uVar15,sVar5,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,uVar36,uVar15,sVar5,opt->blob_allocator);
      }
      pRVar17 = (Reduction *)0x0;
      uVar37 = 0;
      if (0 < (int)uVar36) {
        uVar37 = (ulong)uVar36;
      }
      pRVar33 = (Reduction *)0x0;
      if (0 < (int)uVar15) {
        pRVar33 = pRVar29;
      }
      sVar20 = bottom_blob->elemsize;
      if (iVar2 == 0) {
        sVar31 = (size_t)top_blob->w;
      }
      else {
        sVar31 = top_blob->cstep;
      }
      this = (Reduction *)bottom_blob->data;
      pRVar32 = (Reduction *)(sVar31 * top_blob->elemsize);
      pvVar23 = top_blob->data;
      sVar31 = bottom_blob->cstep;
      for (; pRVar17 != pRVar33;
          pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1)) {
        pRVar16 = this;
        for (uVar41 = 0; uVar37 != uVar41; uVar41 = uVar41 + 1) {
          fVar48 = reduction(local_17c,(float *)pRVar16,uVar24,local_16c);
          *(float *)((long)pvVar23 + uVar41 * 4) = fVar48;
          pRVar16 = (Reduction *)((long)&(pRVar16->super_Layer)._vptr_Layer + (long)(int)uVar24 * 4)
          ;
        }
        pvVar23 = (void *)((long)&(pRVar32->super_Layer)._vptr_Layer + (long)pvVar23);
        this = (Reduction *)((long)&(this->super_Layer)._vptr_Layer + sVar20 * sVar31);
      }
    }
    if (((bVar11 & 1) == 0 && !bVar45) && !bVar8) {
      if (iVar2 == 0) {
        pRVar32 = (Reduction *)(ulong)uVar19;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar19,uVar36,sVar5,opt->blob_allocator);
      }
      else {
        pRVar32 = (Reduction *)0x1;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,1,uVar19,uVar36,1,sVar5,opt->blob_allocator);
      }
      uVar37 = 0;
      if (0 < (int)uVar19) {
        uVar37 = (ulong)uVar19;
      }
      uVar41 = 0;
      if (0 < (int)uVar36) {
        uVar41 = (ulong)uVar36;
      }
      iVar1 = top_blob->w;
      if (iVar2 == 0) {
        iVar13 = 1;
      }
      else {
        iVar13 = top_blob->h;
      }
      local_150 = top_blob->data;
      sVar20 = top_blob->elemsize;
      for (uVar28 = 0; uVar28 != uVar41; uVar28 = uVar28 + 1) {
        lVar26 = (long)bottom_blob->w * bottom_blob->elemsize;
        sVar31 = bottom_blob->cstep;
        pRVar17 = (Reduction *)((long)bottom_blob->h * uVar28 * lVar26 + (long)bottom_blob->data);
        for (uVar38 = 0; uVar37 != uVar38; uVar38 = uVar38 + 1) {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = pRVar17;
          fVar48 = reduction(local_17c,(float *)pRVar17,uVar21,uVar15,(int)sVar31,local_16c);
          *(float *)((long)local_150 + uVar38 * 4) = fVar48;
          pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + lVar26);
        }
        local_150 = (void *)((long)local_150 + (long)iVar13 * sVar20 * (long)iVar1);
      }
    }
    local_c0 = local_c0 | local_c4;
    if ((!bVar46 && (local_c0 & 1) == 0) && !bVar8) {
      if (iVar2 == 0) {
        pRVar32 = (Reduction *)(ulong)uVar21;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,uVar19,sVar5,opt->blob_allocator);
      }
      else {
        pRVar32 = (Reduction *)(ulong)uVar21;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,uVar19,1,1,sVar5,opt->blob_allocator);
      }
      pvVar23 = top_blob->data;
      iVar1 = top_blob->w;
      sVar20 = top_blob->elemsize;
      uVar37 = 0;
      uVar41 = 0;
      if (0 < (int)uVar21) {
        uVar41 = (ulong)uVar21;
      }
      uVar28 = 0;
      if (0 < (int)uVar19) {
        uVar28 = (ulong)uVar19;
      }
      for (; uVar37 != uVar28; uVar37 = uVar37 + 1) {
        iVar13 = bottom_blob->w;
        sVar6 = bottom_blob->cstep;
        sVar31 = bottom_blob->elemsize;
        pvVar40 = bottom_blob->data;
        for (lVar26 = 0; uVar41 * 4 != lVar26; lVar26 = lVar26 + 4) {
          this = (Reduction *)((long)pvVar40 + lVar26 + sVar31 * uVar37 * (long)iVar13);
          pRVar32 = (Reduction *)(ulong)uVar36;
          fVar48 = reduction(local_17c,(float *)this,uVar36,uVar24,uVar15,(int)sVar6,local_16c);
          *(float *)((long)pvVar23 + lVar26) = fVar48;
        }
        pvVar23 = (void *)((long)pvVar23 + (long)iVar1 * sVar20);
      }
    }
    if (((bVar11 & 1) == 0 && !bVar46) && !bVar44) {
      if (iVar2 == 0) {
        pRVar32 = (Reduction *)(ulong)uVar19;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar19,uVar15,sVar5,opt->blob_allocator);
      }
      else {
        pRVar32 = (Reduction *)0x1;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,1,uVar19,1,uVar15,sVar5,opt->blob_allocator);
      }
      uVar37 = 0;
      if (0 < (int)uVar19) {
        uVar37 = (ulong)uVar19;
      }
      pRVar17 = (Reduction *)0x0;
      if (0 < (int)uVar15) {
        pRVar17 = pRVar29;
      }
      sVar20 = bottom_blob->elemsize;
      if (iVar2 == 0) {
        sVar31 = (size_t)top_blob->w;
      }
      else {
        sVar31 = top_blob->cstep;
      }
      pRVar33 = (Reduction *)bottom_blob->data;
      sVar6 = top_blob->elemsize;
      pvVar23 = top_blob->data;
      sVar9 = bottom_blob->cstep;
      for (pRVar16 = (Reduction *)0x0; pRVar16 != pRVar17;
          pRVar16 = (Reduction *)((long)&(pRVar16->super_Layer)._vptr_Layer + 1)) {
        pRVar35 = pRVar33;
        for (uVar41 = 0; uVar37 != uVar41; uVar41 = uVar41 + 1) {
          pRVar32 = (Reduction *)(ulong)uVar21;
          this = pRVar35;
          fVar48 = reduction(local_17c,(float *)pRVar35,uVar21,uVar36,uVar24,local_16c);
          *(float *)((long)pvVar23 + uVar41 * 4) = fVar48;
          pRVar35 = (Reduction *)((long)&(pRVar35->super_Layer)._vptr_Layer + lVar22 * 4);
        }
        pvVar23 = (void *)((long)pvVar23 + sVar31 * sVar6);
        pRVar33 = (Reduction *)((long)&(pRVar33->super_Layer)._vptr_Layer + sVar20 * sVar9);
      }
    }
    if (((bVar12 & 1) == 0 && !bVar45) && !bVar8) {
      if (iVar2 == 0) {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,uVar36,sVar5,opt->blob_allocator);
      }
      else {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,1,uVar36,1,sVar5,opt->blob_allocator);
      }
      pvVar23 = top_blob->data;
      iVar1 = top_blob->w;
      sVar20 = top_blob->elemsize;
      pRVar32 = (Reduction *)0x0;
      uVar37 = 0;
      if (0 < (int)uVar21) {
        uVar37 = (ulong)uVar21;
      }
      pRVar17 = (Reduction *)0x0;
      if (0 < (int)uVar36) {
        pRVar17 = (Reduction *)(ulong)uVar36;
      }
      for (; pRVar32 != pRVar17;
          pRVar32 = (Reduction *)((long)&(pRVar32->super_Layer)._vptr_Layer + 1)) {
        iVar13 = bottom_blob->w;
        iVar4 = bottom_blob->h;
        sVar6 = bottom_blob->cstep;
        sVar31 = bottom_blob->elemsize;
        pvVar40 = bottom_blob->data;
        for (lVar26 = 0; uVar37 * 4 != lVar26; lVar26 = lVar26 + 4) {
          this = (Reduction *)
                 ((long)pvVar40 + lVar26 + sVar31 * (long)pRVar32 * (long)iVar4 * (long)iVar13);
          fVar48 = reduction(local_17c,(float *)this,uVar19,uVar21,uVar15,(int)sVar6,local_16c);
          *(float *)((long)pvVar23 + lVar26) = fVar48;
        }
        pvVar23 = (void *)((long)pvVar23 + (long)iVar1 * sVar20);
      }
    }
    if (((bVar12 & 1) == 0 && !bVar46) && !bVar44) {
      if (iVar2 == 0) {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,uVar15,sVar5,opt->blob_allocator);
      }
      else {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,1,1,uVar15,sVar5,opt->blob_allocator);
      }
      pRVar17 = (Reduction *)0x0;
      uVar37 = 0;
      if (0 < (int)uVar21) {
        uVar37 = (ulong)uVar21;
      }
      pRVar33 = (Reduction *)0x0;
      if (0 < (int)uVar15) {
        pRVar33 = pRVar29;
      }
      sVar20 = bottom_blob->elemsize;
      if (iVar2 == 0) {
        sVar31 = (size_t)top_blob->w;
      }
      else {
        sVar31 = top_blob->cstep;
      }
      pvVar23 = bottom_blob->data;
      pRVar32 = (Reduction *)(sVar31 * top_blob->elemsize);
      pvVar40 = top_blob->data;
      sVar31 = bottom_blob->cstep;
      for (; pRVar17 != pRVar33;
          pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1)) {
        for (lVar26 = 0; uVar37 * 4 != lVar26; lVar26 = lVar26 + 4) {
          this = (Reduction *)((long)pvVar23 + lVar26);
          fVar48 = reduction(local_17c,(float *)this,uVar36 * uVar19,uVar21,local_16c);
          *(float *)((long)pvVar40 + lVar26) = fVar48;
        }
        pvVar40 = (void *)((long)&(pRVar32->super_Layer)._vptr_Layer + (long)pvVar40);
        pvVar23 = (void *)((long)pvVar23 + sVar20 * sVar31);
      }
    }
    if (((bVar11 & 1) == 0 && !bVar45) && !bVar44) {
      if (iVar2 == 0) {
        Mat::create(top_blob,uVar19,uVar36,uVar15,sVar5,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,uVar19,uVar36,uVar15,sVar5,opt->blob_allocator);
      }
      pRVar32 = (Reduction *)bottom_blob->data;
      sVar20 = bottom_blob->elemsize;
      sVar31 = top_blob->elemsize;
      this = (Reduction *)0x0;
      pRVar17 = (Reduction *)(ulong)(uVar36 * uVar19);
      if ((int)(uVar36 * uVar19) < 1) {
        pRVar17 = this;
      }
      pRVar33 = (Reduction *)0x0;
      if (0 < (int)uVar15) {
        pRVar33 = pRVar29;
      }
      sVar6 = top_blob->cstep;
      pvVar23 = top_blob->data;
      sVar9 = bottom_blob->cstep;
      pRVar16 = pRVar32;
      for (; this != pRVar33; this = (Reduction *)((long)&(this->super_Layer)._vptr_Layer + 1)) {
        pRVar35 = pRVar16;
        for (pRVar27 = (Reduction *)0x0; pRVar17 != pRVar27;
            pRVar27 = (Reduction *)((long)&(pRVar27->super_Layer)._vptr_Layer + 1)) {
          pRVar32 = (Reduction *)(ulong)uVar21;
          fVar48 = reduction(local_17c,(float *)pRVar35,uVar21,local_16c);
          *(float *)((long)pvVar23 + (long)pRVar27 * 4) = fVar48;
          pRVar35 = (Reduction *)((long)&(pRVar35->super_Layer)._vptr_Layer + lVar22 * 4);
        }
        pvVar23 = (void *)((long)pvVar23 + sVar31 * sVar6);
        pRVar16 = (Reduction *)((long)&(pRVar16->super_Layer)._vptr_Layer + sVar20 * sVar9);
      }
    }
    if (((local_c0 & 1) == 0 && !bVar45) && !bVar8) {
      if (iVar2 == 0) {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,uVar19,uVar36,sVar5,opt->blob_allocator);
      }
      else {
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,uVar19,uVar36,1,sVar5,opt->blob_allocator);
      }
      pRVar32 = (Reduction *)0x0;
      uVar37 = 0;
      if (0 < (int)uVar24) {
        uVar37 = (ulong)uVar24;
      }
      pRVar17 = (Reduction *)0x0;
      if (0 < (int)uVar36) {
        pRVar17 = (Reduction *)(ulong)uVar36;
      }
      if (iVar2 == 0) {
        sVar20 = top_blob->cstep;
      }
      else {
        sVar20 = (long)top_blob->h * (long)top_blob->w;
      }
      pvVar23 = top_blob->data;
      sVar31 = top_blob->elemsize;
      for (; pRVar32 != pRVar17;
          pRVar32 = (Reduction *)((long)&(pRVar32->super_Layer)._vptr_Layer + 1)) {
        iVar1 = bottom_blob->w;
        iVar13 = bottom_blob->h;
        sVar9 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        pvVar40 = bottom_blob->data;
        for (lVar22 = 0; uVar37 * 4 != lVar22; lVar22 = lVar22 + 4) {
          this = (Reduction *)
                 ((long)pvVar40 + lVar22 + sVar6 * (long)pRVar32 * (long)iVar13 * (long)iVar1);
          fVar48 = reduction(local_17c,(float *)this,uVar15,(int)sVar9,local_16c);
          *(float *)((long)pvVar23 + lVar22) = fVar48;
        }
        pvVar23 = (void *)((long)pvVar23 + sVar20 * sVar31);
      }
    }
    if (((bVar12 & 1) == 0 && !bVar45) && !bVar44) {
      if (iVar2 == 0) {
        Mat::create(top_blob,uVar21,uVar36,uVar15,sVar5,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,uVar21,1,uVar36,uVar15,sVar5,opt->blob_allocator);
      }
      iVar1 = top_blob->w;
      pvVar23 = top_blob->data;
      sVar20 = top_blob->elemsize;
      uVar37 = 0;
      if (0 < (int)uVar21) {
        uVar37 = (ulong)uVar21;
      }
      uVar41 = 0;
      if (0 < (int)uVar36) {
        uVar41 = (ulong)uVar36;
      }
      pRVar32 = (Reduction *)0x0;
      pRVar17 = (Reduction *)0x0;
      if (0 < (int)uVar15) {
        pRVar17 = pRVar29;
      }
      sVar31 = top_blob->cstep;
      this = pRVar17;
      for (; pRVar32 != pRVar17;
          pRVar32 = (Reduction *)((long)&(pRVar32->super_Layer)._vptr_Layer + 1)) {
        pvVar39 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * (long)pRVar32 +
                          (long)bottom_blob->data);
        pRVar33 = (Reduction *)((long)bottom_blob->h * bottom_blob->elemsize * (long)bottom_blob->w)
        ;
        this = pRVar33;
        pvVar40 = pvVar23;
        for (uVar28 = 0; uVar28 != uVar41; uVar28 = uVar28 + 1) {
          for (lVar22 = 0; uVar37 * 4 != lVar22; lVar22 = lVar22 + 4) {
            this = (Reduction *)((long)pvVar39 + lVar22);
            fVar48 = reduction(local_17c,(float *)this,uVar19,uVar21,local_16c);
            *(float *)((long)pvVar40 + lVar22) = fVar48;
          }
          pvVar40 = (void *)((long)pvVar40 + (long)iVar1 * sVar20);
          pvVar39 = (void *)((long)&(pRVar33->super_Layer)._vptr_Layer + (long)pvVar39);
        }
        pvVar23 = (void *)((long)pvVar23 + sVar31 * sVar20);
      }
    }
    if ((!bVar46 && (local_c0 & 1) == 0) && !bVar44) {
      if (iVar2 == 0) {
        pRVar32 = (Reduction *)(ulong)uVar21;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,uVar19,uVar15,sVar5,opt->blob_allocator);
      }
      else {
        pRVar32 = (Reduction *)(ulong)uVar21;
        this = (Reduction *)top_blob;
        Mat::create(top_blob,uVar21,uVar19,1,uVar15,sVar5,opt->blob_allocator);
      }
      pvVar23 = bottom_blob->data;
      sVar5 = top_blob->elemsize;
      sVar20 = top_blob->cstep;
      pRVar17 = (Reduction *)0x0;
      uVar37 = 0;
      if (0 < (int)uVar24) {
        uVar37 = (ulong)uVar24;
      }
      sVar31 = bottom_blob->elemsize;
      if ((int)uVar15 < 1) {
        pRVar29 = pRVar17;
      }
      pvVar40 = top_blob->data;
      sVar6 = bottom_blob->cstep;
      for (; pRVar17 != pRVar29;
          pRVar17 = (Reduction *)((long)&(pRVar17->super_Layer)._vptr_Layer + 1)) {
        for (lVar22 = 0; uVar37 * 4 != lVar22; lVar22 = lVar22 + 4) {
          this = (Reduction *)((long)pvVar23 + lVar22);
          pRVar32 = (Reduction *)(ulong)uVar36;
          fVar48 = reduction(local_17c,(float *)this,uVar36,uVar24,local_16c);
          *(float *)((long)pvVar40 + lVar22) = fVar48;
        }
        pvVar40 = (void *)((long)pvVar40 + sVar5 * sVar20);
        pvVar23 = (void *)((long)pvVar23 + sVar31 * sVar6);
      }
    }
    bVar8 = true;
    bVar46 = false;
    bVar47 = false;
  }
LAB_002fabf4:
  uVar30 = SUB84(pRVar32,0);
  uVar21 = (uint)this;
  if (iVar55 - 9U < 2) {
    uVar21 = top_blob->c * (int)top_blob->cstep;
    pvVar23 = top_blob->data;
    uVar41 = 0;
    uVar37 = (ulong)uVar21;
    if ((int)uVar21 < 1) {
      uVar37 = uVar41;
    }
    while( true ) {
      uVar30 = SUB84(pRVar32,0);
      uVar21 = (uint)this;
      if (uVar37 == uVar41) break;
      fVar48 = logf(*(float *)((long)pvVar23 + uVar41 * 4));
      *(float *)((long)pvVar23 + uVar41 * 4) = fVar48;
      uVar41 = uVar41 + 1;
    }
  }
  if (iVar55 == 3) {
    uVar19 = bottom_blob->w;
    uVar36 = 1;
    uVar15 = uVar36;
    if (uVar14 == 1) {
      uVar15 = uVar19;
    }
    auVar57._0_8_ = auVar56._0_8_ << 0x3f;
    auVar57._8_8_ = auVar56._8_8_ << 0x3f;
    if (bVar46) {
      uVar14 = movmskpd(uVar30,auVar57);
      uVar21 = 1;
      if ((uVar14 & 2) != 0) {
        uVar21 = uVar19;
      }
      uVar15 = uVar15 * uVar21;
      if ((uVar14 & 1) != 0) {
        uVar15 = uVar15 * bottom_blob->h;
      }
    }
    if (bVar47) {
      uVar21 = movmskpd(uVar21,auVar57);
      uVar14 = 1;
      uVar24 = uVar14;
      if ((uVar21 & 2) != 0) {
        uVar24 = uVar19;
      }
      if ((uVar21 & 1) != 0) {
        uVar14 = bottom_blob->h;
      }
      uVar15 = uVar15 * uVar24 * uVar14;
      if (bVar44) {
        uVar15 = uVar15 * bottom_blob->c;
      }
    }
    if (bVar8) {
      uVar14 = movmskpd(uVar21,auVar57);
      if ((uVar14 & 2) == 0) {
        uVar19 = uVar36;
      }
      uVar21 = uVar36;
      if ((uVar14 & 1) != 0) {
        uVar21 = bottom_blob->h;
      }
      if (bVar45) {
        uVar36 = bottom_blob->d;
      }
      uVar15 = uVar15 * uVar19 * uVar36 * uVar21;
      if (bVar44) {
        uVar15 = uVar15 * bottom_blob->c;
      }
    }
    local_b4 = local_b4 / (float)(int)uVar15;
  }
  else if (iVar55 == 8) {
    uVar14 = top_blob->c * (int)top_blob->cstep;
    pvVar23 = top_blob->data;
    uVar41 = 0;
    uVar37 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar37 = uVar41;
    }
    for (; uVar37 != uVar41; uVar41 = uVar41 + 1) {
      fVar48 = *(float *)((long)pvVar23 + uVar41 * 4);
      *(float *)((long)pvVar23 + uVar41 * 4) =
           SQRT((float)(~-(uint)(fVar48 < 1.1754944e-38) & (uint)fVar48));
    }
  }
  if (local_b4 != 1.0) {
    uVar14 = top_blob->c * (int)top_blob->cstep;
    pvVar23 = top_blob->data;
    uVar37 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar37 = 0;
    }
    for (uVar41 = 0; uVar37 != uVar41; uVar41 = uVar41 + 1) {
      *(float *)((long)pvVar23 + uVar41 * 4) = *(float *)((long)pvVar23 + uVar41 * 4) * local_b4;
    }
  }
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[4] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_d = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_d = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims;
            axes_flag[axis] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
        else if (dims == 4)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_d = true;
            if (axes_flag[2] == 1) reduce_h = true;
            if (axes_flag[3] == 1) reduce_w = true;
        }
    }

    return reduction_op(bottom_blob, top_blob, reduce_w, reduce_h, reduce_d, reduce_c, keepdims, operation, coeff, opt);
}